

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O1

char * directory_read(DIR *ref,char *win32buffer)

{
  bool bVar1;
  dirent *pdVar2;
  char *unaff_R14;
  
  if (ref == (DIR *)0x0) {
    unaff_R14 = (char *)0x0;
  }
  else {
    do {
      pdVar2 = readdir((DIR *)ref);
      if (pdVar2 == (dirent *)0x0) {
        closedir((DIR *)ref);
        bVar1 = true;
        unaff_R14 = (char *)0x0;
      }
      else {
        bVar1 = false;
        if ((pdVar2->d_name[0] != '\0') && (pdVar2->d_name[0] != '.')) {
          unaff_R14 = pdVar2->d_name;
          bVar1 = true;
        }
      }
    } while (!bVar1);
  }
  return unaff_R14;
}

Assistant:

char *directory_read (DIRREF ref, char *win32buffer) {
	if (ref == NULL) return NULL;
	
	while (1) {
		#ifdef WIN32
		WIN32_FIND_DATAA findData;
		
		if (FindNextFileA(ref, &findData) == 0) {
			FindClose(ref);
			return NULL;
		}
		if (findData.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) continue;
		if (findData.cFileName[0] == '\0') continue;
		if (findData.cFileName[0] == '.') continue;
		// cFileName from WIN32_FIND_DATAA is a fixed size array, and findData is local
		// This line of code is under the assumption that `win32buffer` is at least MAX_PATH in size!
		return !win32buffer ? NULL : memcpy(win32buffer, findData.cFileName, sizeof(findData.cFileName));
		#else
        UNUSED_PARAM(win32buffer);
		struct dirent *d;
		if ((d = readdir(ref)) == NULL) {
			closedir(ref);
			return NULL;
		}
		if (d->d_name[0] == '\0') continue;
		if (d->d_name[0] == '.') continue;
		return (char *)d->d_name;
		#endif
	}
	return NULL;
}